

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void cleanup_themed(void)

{
  vault *pvVar1;
  vault *p;
  
  p = themed_levels;
  while (p != (vault *)0x0) {
    pvVar1 = p->next;
    mem_free(p->name);
    mem_free(p->typ);
    mem_free(p->text);
    mem_free(p);
    p = pvVar1;
  }
  return;
}

Assistant:

static void cleanup_themed(void)
{
	struct vault *v, *next;
	for (v = themed_levels; v; v = next) {
		next = v->next;
		mem_free(v->name);
		mem_free(v->typ);
		mem_free(v->text);
		mem_free(v);
	}
}